

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall xercesc_4_0::TraverseSchema::traverseInclude(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *pSVar1;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar2;
  SchemaInfo *pSVar3;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar4;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_28;
  
  pSVar1 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_28.fScopeAdded = false;
  }
  else {
    local_28.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  pRVar2 = this->fPreprocessedNodes->fBucketList
           [(ulong)elem % this->fPreprocessedNodes->fHashModulus];
  pRVar4 = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
  if (pRVar2 != (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
    do {
      pRVar4 = pRVar2;
      if ((DOMElement *)pRVar2->fKey == elem) break;
      pRVar2 = pRVar2->fNext;
      pRVar4 = (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0;
    } while (pRVar2 != (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0);
  }
  if (pRVar4 == (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
    pSVar3 = (SchemaInfo *)0x0;
  }
  else {
    pSVar3 = pRVar4->fData;
  }
  local_28.fSchemaInfo = pSVar1;
  if (pSVar3 != (SchemaInfo *)0x0) {
    pSVar1 = this->fSchemaInfo;
    this->fSchemaInfo = pSVar3;
    processChildren(this,pSVar3->fSchemaRootElement);
    this->fSchemaInfo = pSVar1;
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_28);
  return;
}

Assistant:

void TraverseSchema::traverseInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* includeInfo = fPreprocessedNodes->get(elem);

    if (includeInfo) {

        SchemaInfo* saveInfo = fSchemaInfo;

        fSchemaInfo = includeInfo;
        processChildren(includeInfo->getRoot());
        fSchemaInfo = saveInfo;
    }
}